

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O0

ForwardingTypedefSymbol *
slang::ast::ForwardingTypedefSymbol::fromSyntax
          (Scope *scope,ForwardTypedefDeclarationSyntax *syntax)

{
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  __extent_storage<18446744073709551615UL> _Var1;
  SourceLocation args_1;
  ForwardingTypedefSymbol *this;
  SyntaxNode *in_RSI;
  Scope *in_RDI;
  string_view sVar2;
  ForwardingTypedefSymbol *result;
  Compilation *comp;
  ForwardTypeRestriction typeRestriction;
  Token *in_stack_ffffffffffffffb0;
  ForwardTypeRestriction *in_stack_ffffffffffffffb8;
  
  if (*(long *)(in_RSI + 4) != 0) {
    SemanticFacts::getTypeRestriction(*(ForwardTypeRestrictionSyntax **)(in_RSI + 4));
  }
  _Var1._M_extent_value = (size_t)Scope::getCompilation(in_RDI);
  sVar2 = parsing::Token::valueText(in_stack_ffffffffffffffb0);
  args_1 = parsing::Token::location((Token *)&in_RSI[4].parent);
  this = BumpAllocator::
         emplace<slang::ast::ForwardingTypedefSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::ForwardTypeRestriction&>
                   ((BumpAllocator *)sVar2._M_str,
                    (basic_string_view<char,_std::char_traits<char>_> *)sVar2._M_len,
                    (SourceLocation *)args_1,in_stack_ffffffffffffffb8);
  Symbol::setSyntax(&this->super_Symbol,in_RSI);
  std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
  span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
            ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *)
             in_stack_ffffffffffffffb0,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_RDI)
  ;
  syntax_00._M_extent._M_extent_value = _Var1._M_extent_value;
  syntax_00._M_ptr = (pointer)this;
  Symbol::setAttributes((Symbol *)sVar2._M_str,(Scope *)sVar2._M_len,syntax_00);
  return this;
}

Assistant:

ForwardingTypedefSymbol& ForwardingTypedefSymbol::fromSyntax(
    const Scope& scope, const ForwardTypedefDeclarationSyntax& syntax) {

    auto typeRestriction = ForwardTypeRestriction::None;
    if (syntax.typeRestriction)
        typeRestriction = SemanticFacts::getTypeRestriction(*syntax.typeRestriction);

    auto& comp = scope.getCompilation();
    auto result = comp.emplace<ForwardingTypedefSymbol>(syntax.name.valueText(),
                                                        syntax.name.location(), typeRestriction);
    result->setSyntax(syntax);
    result->setAttributes(scope, syntax.attributes);
    return *result;
}